

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cc
# Opt level: O2

int main(int argc,char **argv)

{
  QuantizationType QVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  ostream *poVar6;
  ostringstream *this;
  UniformQuantization *this_00;
  char *pcVar7;
  allocator local_41d;
  int num_bit;
  QuantizationType local_418;
  int output;
  double absolute_maximum_value;
  undefined1 local_408 [32];
  UniformQuantization uniform_quantization;
  double input;
  ostringstream error_message_6;
  ifstream ifs;
  byte abStack_218 [488];
  
  absolute_maximum_value = 32768.0;
  num_bit = 8;
  local_418 = kMidRise;
  QVar1 = kMidRise;
LAB_00102620:
  while (iVar5 = ya_getopt_long(argc,argv,"v:b:t:o:h",(option *)0x0,(int *)0x0), iVar5 == 0x62) {
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_6);
    bVar2 = sptk::ConvertStringToInteger((string *)&ifs,&num_bit);
    bVar3 = num_bit < 1;
    std::__cxx11::string::~string((string *)&ifs);
    if (!bVar2 || bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      std::operator<<((ostream *)&ifs,"The argument for the -b option must be a positive integer");
      std::__cxx11::string::string
                ((string *)&error_message_6,"quantize",(allocator *)&uniform_quantization);
      sptk::PrintErrorMessage((string *)&error_message_6,(ostringstream *)&ifs);
LAB_001029c6:
      std::__cxx11::string::~string((string *)&error_message_6);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
      return 1;
    }
  }
  if (iVar5 == 0x76) {
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_6);
    bVar2 = sptk::ConvertStringToDouble((string *)&ifs,&absolute_maximum_value);
    bVar3 = absolute_maximum_value <= 0.0;
    std::__cxx11::string::~string((string *)&ifs);
    if (!bVar2 || bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      std::operator<<((ostream *)&ifs,"The argument for the -v option must be a positive number");
      std::__cxx11::string::string
                ((string *)&error_message_6,"quantize",(allocator *)&uniform_quantization);
      sptk::PrintErrorMessage((string *)&error_message_6,(ostringstream *)&ifs);
      goto LAB_001029c6;
    }
    goto LAB_00102620;
  }
  if (iVar5 == -1) {
    if (1 < argc - ya_optind) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      std::operator<<((ostream *)&ifs,"Too many input files");
      std::__cxx11::string::string
                ((string *)&error_message_6,"quantize",(allocator *)&uniform_quantization);
      sptk::PrintErrorMessage((string *)&error_message_6,(ostringstream *)&ifs);
      goto LAB_001029c6;
    }
    if (argc == ya_optind) {
      pcVar7 = (char *)0x0;
    }
    else {
      pcVar7 = argv[ya_optind];
    }
    bVar3 = sptk::SetBinaryMode();
    this = (ostringstream *)&ifs;
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream(this);
      std::operator<<((ostream *)this,"Cannot set translation mode");
      std::__cxx11::string::string
                ((string *)&error_message_6,"quantize",(allocator *)&uniform_quantization);
      sptk::PrintErrorMessage((string *)&error_message_6,(ostringstream *)&ifs);
      goto LAB_001029c6;
    }
    std::ifstream::ifstream(this);
    if ((pcVar7 != (char *)0x0) &&
       (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar7),
       (abStack_218[*(long *)(_ifs + -0x18)] & 5) != 0)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_6);
      poVar6 = std::operator<<((ostream *)&error_message_6,"Cannot open file ");
      std::operator<<(poVar6,pcVar7);
      std::__cxx11::string::string
                ((string *)&uniform_quantization,"quantize",(allocator *)local_408);
      sptk::PrintErrorMessage((string *)&uniform_quantization,&error_message_6);
      this_00 = &uniform_quantization;
      goto LAB_00102c86;
    }
    cVar4 = std::__basic_file<char>::is_open();
    if (cVar4 == '\0') {
      this = (ostringstream *)&std::cin;
    }
    sptk::UniformQuantization::UniformQuantization
              (&uniform_quantization,absolute_maximum_value,num_bit,local_418);
    if (uniform_quantization.is_valid_ != false) {
      goto LAB_00102a4e;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_6);
    std::operator<<((ostream *)&error_message_6,"Failed to initialize UniformQuantization");
    std::__cxx11::string::string((string *)local_408,"quantize",(allocator *)&input);
    sptk::PrintErrorMessage((string *)local_408,&error_message_6);
    goto LAB_00102c81;
  }
  if (iVar5 == 0x68) {
    anon_unknown.dwarf_1d6b::PrintUsage((ostream *)&std::cout);
    return 0;
  }
  if (iVar5 != 0x6f) {
    if (iVar5 != 0x74) {
      anon_unknown.dwarf_1d6b::PrintUsage((ostream *)&std::cerr);
      return 1;
    }
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_6);
    bVar3 = sptk::ConvertStringToInteger((string *)&ifs,(int *)&uniform_quantization);
    if (bVar3) {
      bVar3 = sptk::IsInRange((QuantizationType)uniform_quantization._vptr_UniformQuantization,0,1);
      std::__cxx11::string::~string((string *)&ifs);
      if (bVar3) {
        local_418 = (QuantizationType)uniform_quantization._vptr_UniformQuantization;
        goto LAB_00102620;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&ifs);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar6 = std::operator<<((ostream *)&ifs,"The argument for the -t option must be an integer ");
    poVar6 = std::operator<<(poVar6,"in the range of ");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0);
    poVar6 = std::operator<<(poVar6," to ");
    std::ostream::operator<<((ostream *)poVar6,1);
    std::__cxx11::string::string((string *)&error_message_6,"quantize",(allocator *)local_408);
    sptk::PrintErrorMessage((string *)&error_message_6,(ostringstream *)&ifs);
    goto LAB_001029c6;
  }
  std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_6);
  bVar3 = sptk::ConvertStringToInteger((string *)&ifs,(int *)&uniform_quantization);
  if (bVar3) {
    bVar3 = sptk::IsInRange((QuantizationType)uniform_quantization._vptr_UniformQuantization,0,1);
    std::__cxx11::string::~string((string *)&ifs);
    QVar1 = (QuantizationType)uniform_quantization._vptr_UniformQuantization;
    if (bVar3) goto LAB_00102620;
  }
  else {
    std::__cxx11::string::~string((string *)&ifs);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
  poVar6 = std::operator<<((ostream *)&ifs,"The argument for the -o option must be an integer ");
  poVar6 = std::operator<<(poVar6,"in the range of ");
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0);
  poVar6 = std::operator<<(poVar6," to ");
  std::ostream::operator<<((ostream *)poVar6,1);
  std::__cxx11::string::string((string *)&error_message_6,"quantize",(allocator *)local_408);
  sptk::PrintErrorMessage((string *)&error_message_6,(ostringstream *)&ifs);
  goto LAB_001029c6;
LAB_00102a4e:
  bVar3 = sptk::ReadStream<double>(&input,(istream *)this);
  if (!bVar3) {
    iVar5 = 0;
    goto LAB_00102c98;
  }
  bVar3 = sptk::UniformQuantization::Run(&uniform_quantization,input,&output);
  if (!bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_6);
    std::operator<<((ostream *)&error_message_6,"Failed to quantize input");
    std::__cxx11::string::string((string *)local_408,"quantize",&local_41d);
    sptk::PrintErrorMessage((string *)local_408,&error_message_6);
    goto LAB_00102c81;
  }
  if (QVar1 == kMidTread) {
    output = output + uniform_quantization.quantization_levels_ / -2;
  }
  bVar3 = sptk::WriteStream<int>(output,(ostream *)&std::cout);
  if (!bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_6);
    std::operator<<((ostream *)&error_message_6,"Failed to write a quantized sequence");
    std::__cxx11::string::string((string *)local_408,"quantize",&local_41d);
    sptk::PrintErrorMessage((string *)local_408,&error_message_6);
LAB_00102c81:
    this_00 = (UniformQuantization *)local_408;
LAB_00102c86:
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_6);
    iVar5 = 1;
LAB_00102c98:
    std::ifstream::~ifstream(&ifs);
    return iVar5;
  }
  goto LAB_00102a4e;
}

Assistant:

int main(int argc, char* argv[]) {
  double absolute_maximum_value(kDefaultAbsoluteMaximumValue);
  int num_bit(kDefaultNumBit);
  sptk::UniformQuantization::QuantizationType quantization_type(
      kDefaultQuantizationType);
  OutputFormats output_format(kDefaultOutputFormat);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "v:b:t:o:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'v': {
        if (!sptk::ConvertStringToDouble(optarg, &absolute_maximum_value) ||
            absolute_maximum_value <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -v option must be a positive number";
          sptk::PrintErrorMessage("quantize", error_message);
          return 1;
        }
        break;
      }
      case 'b': {
        if (!sptk::ConvertStringToInteger(optarg, &num_bit) || num_bit <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -b option must be a positive integer";
          sptk::PrintErrorMessage("quantize", error_message);
          return 1;
        }
        break;
      }
      case 't': {
        const int min(0);
        const int max(
            static_cast<int>(sptk::UniformQuantization::QuantizationType::
                                 kNumQuantizationTypes) -
            1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -t option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("quantize", error_message);
          return 1;
        }
        quantization_type =
            static_cast<sptk::UniformQuantization::QuantizationType>(tmp);
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("quantize", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("quantize", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("quantize", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("quantize", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::UniformQuantization uniform_quantization(absolute_maximum_value,
                                                 num_bit, quantization_type);
  if (!uniform_quantization.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize UniformQuantization";
    sptk::PrintErrorMessage("quantize", error_message);
    return 1;
  }

  const int bias(-uniform_quantization.GetQuantizationLevels() / 2);
  double input;
  int output;

  while (sptk::ReadStream(&input, &input_stream)) {
    if (!uniform_quantization.Run(input, &output)) {
      std::ostringstream error_message;
      error_message << "Failed to quantize input";
      sptk::PrintErrorMessage("quantize", error_message);
      return 1;
    }

    if (kInteger == output_format) {
      output += bias;
    }

    if (!sptk::WriteStream(output, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write a quantized sequence";
      sptk::PrintErrorMessage("quantize", error_message);
      return 1;
    }
  }

  return 0;
}